

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::clearBufferiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,int *value)

{
  bool bVar1;
  ChannelOrder CVar2;
  ChannelOrder CVar3;
  int iVar4;
  byte bVar5;
  ConstPixelBufferAccess *pCVar6;
  InternalError *this_00;
  int iVar7;
  ConstPixelBufferAccess *pCVar8;
  long lVar9;
  int iVar10;
  ConstPixelBufferAccess *pCVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  MultisamplePixelBufferAccess access;
  MultisamplePixelBufferAccess colorBuf;
  MultisamplePixelBufferAccess access_1;
  byte local_f8;
  MultisampleConstPixelBufferAccess local_e8;
  ConstPixelBufferAccess local_c0;
  ConstPixelBufferAccess local_98;
  MultisamplePixelBufferAccess local_68;
  
  if ((buffer & 0xfffffffd) != 0x1800) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (drawbuffer != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (this->m_scissorEnabled == true) {
    iVar13 = (this->m_scissorBox).m_data[0];
    iVar12 = (this->m_scissorBox).m_data[1];
    iVar14 = (this->m_scissorBox).m_data[2];
    iVar15 = (this->m_scissorBox).m_data[3];
  }
  else {
    iVar12 = 0;
    iVar15 = 0x7fffffff;
    iVar14 = 0x7fffffff;
    iVar13 = 0;
  }
  if (buffer == 0x1802) {
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&local_e8,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&local_c0,
               (MultisamplePixelBufferAccess *)&local_e8);
    iVar10 = 0;
    if (0 < iVar13) {
      iVar10 = iVar13;
    }
    iVar7 = 0;
    if (0 < iVar12) {
      iVar7 = iVar12;
    }
    iVar4 = iVar14 + iVar13;
    if (local_c0.m_size.m_data[1] <= iVar14 + iVar13) {
      iVar4 = local_c0.m_size.m_data[1];
    }
    iVar13 = iVar15 + iVar12;
    if (local_c0.m_size.m_data[2] <= iVar15 + iVar12) {
      iVar13 = local_c0.m_size.m_data[2];
    }
    iVar13 = iVar13 - iVar7;
    iVar12 = 0;
    if (0 < iVar13) {
      iVar12 = iVar13;
    }
    if (iVar4 - iVar10 < 1) {
      return;
    }
    if (iVar13 < 1) {
      return;
    }
    if (this->m_stencil[0].writeMask == 0) {
      return;
    }
    rr::getSubregion(&local_68,(MultisamplePixelBufferAccess *)&local_e8,iVar10,iVar7,iVar4 - iVar10
                     ,iVar12);
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)&local_c0,&local_68.m_access,MODE_STENCIL);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_c0);
    if (local_98.m_size.m_data[2] < 1) {
      return;
    }
    CVar2 = *value;
    iVar14 = 0;
    iVar13 = local_98.m_size.m_data[2];
    iVar12 = local_98.m_size.m_data[1];
    do {
      if (0 < iVar12) {
        iVar10 = 0;
        iVar15 = local_98.m_size.m_data[0];
        do {
          if (0 < iVar15) {
            iVar13 = 0;
            do {
              CVar3 = this->m_stencil[0].writeMask;
              tcu::ConstPixelBufferAccess::getPixelInt(&local_c0,(int)&local_98,iVar13,iVar10);
              local_c0.m_format.order =
                   (CVar2 ^ local_c0.m_format.order) & CVar3 ^ local_c0.m_format.order;
              local_c0.m_format.type = SNORM_INT8;
              local_c0.m_size.m_data[0] = 0;
              local_c0.m_size.m_data[1] = 0;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_98,(IVec4 *)&local_c0,iVar13,iVar10,iVar14);
              iVar13 = iVar13 + 1;
            } while (iVar13 < local_98.m_size.m_data[0]);
            iVar12 = local_98.m_size.m_data[1];
            iVar15 = local_98.m_size.m_data[0];
          }
          iVar10 = iVar10 + 1;
          iVar13 = local_98.m_size.m_data[2];
        } while (iVar10 < iVar12);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < iVar13);
    return;
  }
  if (buffer != 0x1800) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,(char *)0x0,"buffer == GL_STENCIL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
               ,0xd78);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  getDrawColorbuffer((MultisamplePixelBufferAccess *)&local_c0,this);
  bVar1 = (this->m_colorMask).m_data[1];
  if ((this->m_colorMask).m_data[0] == true) {
    if ((bVar1 == false) || ((this->m_colorMask).m_data[2] != true)) goto LAB_0098cbac;
    bVar5 = (this->m_colorMask).m_data[3] ^ 1;
  }
  else {
    if ((bVar1 == false) && ((this->m_colorMask).m_data[2] == false)) {
      bVar5 = 1;
      local_f8 = (this->m_colorMask).m_data[3] ^ 1;
      goto LAB_0098cbb8;
    }
LAB_0098cbac:
    bVar5 = 1;
  }
  local_f8 = 0;
LAB_0098cbb8:
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&local_e8,(MultisamplePixelBufferAccess *)&local_c0);
  iVar10 = 0;
  if (0 < iVar13) {
    iVar10 = iVar13;
  }
  iVar7 = 0;
  if (0 < iVar12) {
    iVar7 = iVar12;
  }
  iVar4 = iVar14 + iVar13;
  if (local_e8.m_access.m_size.m_data[1] <= iVar14 + iVar13) {
    iVar4 = local_e8.m_access.m_size.m_data[1];
  }
  iVar13 = iVar15 + iVar12;
  if (local_e8.m_access.m_size.m_data[2] <= iVar15 + iVar12) {
    iVar13 = local_e8.m_access.m_size.m_data[2];
  }
  if (((0 < iVar4 - iVar10) && (0 < iVar13 - iVar7)) && (local_f8 == 0)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_e8,
                     (MultisamplePixelBufferAccess *)&local_c0,iVar10,iVar7,iVar4 - iVar10,
                     iVar13 - iVar7);
    local_98.m_format.order = value[0];
    local_98.m_format.type = value[1];
    local_98.m_size.m_data._0_8_ = *(undefined8 *)(value + 2);
    if (bVar5 == 0) {
      rr::clear((MultisamplePixelBufferAccess *)&local_e8,(IVec4 *)&local_98);
    }
    else if (0 < local_e8.m_access.m_size.m_data[2]) {
      iVar14 = 0;
      iVar13 = local_e8.m_access.m_size.m_data[2];
      iVar12 = local_e8.m_access.m_size.m_data[1];
      do {
        if (0 < iVar12) {
          iVar10 = 0;
          iVar15 = local_e8.m_access.m_size.m_data[0];
          do {
            if (0 < iVar15) {
              iVar13 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_e8,iVar13,
                           iVar10);
                local_68.m_access.super_ConstPixelBufferAccess.m_format.order = R;
                local_68.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                local_68.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                local_68.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
                pCVar6 = &local_98;
                lVar9 = 0;
                pCVar8 = (ConstPixelBufferAccess *)&stack0xffffffffffffffc0;
                do {
                  pCVar11 = pCVar8;
                  if ((this->m_colorMask).m_data[lVar9] != false) {
                    pCVar11 = pCVar6;
                  }
                  local_68.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
                       (pCVar11->m_format).order;
                  lVar9 = lVar9 + 1;
                  pCVar8 = (ConstPixelBufferAccess *)&(pCVar8->m_format).type;
                  pCVar6 = (ConstPixelBufferAccess *)&(pCVar6->m_format).type;
                } while (lVar9 != 4);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_e8,(IVec4 *)&local_68,iVar13,iVar10,iVar14);
                iVar13 = iVar13 + 1;
                iVar12 = local_e8.m_access.m_size.m_data[1];
                iVar15 = local_e8.m_access.m_size.m_data[0];
              } while (iVar13 < local_e8.m_access.m_size.m_data[0]);
            }
            iVar10 = iVar10 + 1;
            iVar13 = local_e8.m_access.m_size.m_data[2];
          } while (iVar10 < iVar12);
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 < iVar13);
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferiv (deUint32 buffer, int drawbuffer, const int* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_STENCIL, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			IVec4								color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelInt(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_STENCIL);

		rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(stencilBuf));

		if (!isEmpty(area) && m_stencil[rr::FACETYPE_FRONT].writeMask != 0)
		{
			rr::MultisamplePixelBufferAccess	access		= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, area.x(), area.y(), area.z(), area.w()));
			int									stencil		= value[0];

			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
	}
}